

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::ForAllStructFields
          (RustGenerator *this,StructDef *struct_def,
          function<void_(const_flatbuffers::FieldDef_&)> *cb)

{
  bool bVar1;
  reference ppFVar2;
  char *__s;
  size_t sVar3;
  bool local_22a;
  size_t size;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  string local_170;
  allocator<char> local_149;
  string local_148;
  string local_128;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  allocator<char> local_61;
  string local_60;
  FieldDef *local_40;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_30;
  const_iterator it;
  size_t offset_to_field;
  function<void_(const_flatbuffers::FieldDef_&)> *cb_local;
  StructDef *struct_def_local;
  RustGenerator *this_local;
  
  it._M_current = (FieldDef **)0x0;
  local_30._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppFVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"FIELD_TYPE",&local_61);
    GetTypeGet_abi_cxx11_(&local_98,this,&(local_40->value).type);
    CodeWriter::SetValue(&this->code_,&local_60,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"FIELD_OTY",&local_b9);
    ObjectFieldType_abi_cxx11_(&local_e0,this,local_40,false);
    CodeWriter::SetValue(&this->code_,&local_b8,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"FIELD",&local_101);
    IdlNamer::Field_abi_cxx11_(&local_128,&this->namer_,local_40);
    CodeWriter::SetValue(&this->code_,&local_100,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"FIELD_OFFSET",&local_149);
    NumToString<unsigned_long>(&local_170,(unsigned_long)it._M_current);
    CodeWriter::SetValue(&this->code_,&local_148,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"REF",&local_191);
    bVar1 = IsStruct(&(local_40->value).type);
    local_22a = true;
    if (!bVar1) {
      local_22a = IsArray(&(local_40->value).type);
    }
    __s = "";
    if (local_22a != false) {
      __s = "&";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,__s,(allocator<char> *)((long)&size + 7));
    CodeWriter::SetValue(&this->code_,&local_190,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    CodeWriter::IncrementIdentLevel(&this->code_);
    std::function<void_(const_flatbuffers::FieldDef_&)>::operator()(cb,local_40);
    CodeWriter::DecrementIdentLevel(&this->code_);
    sVar3 = InlineSize(&(local_40->value).type);
    it._M_current = sVar3 + local_40->padding + it._M_current;
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void ForAllStructFields(const StructDef &struct_def,
                          std::function<void(const FieldDef &field)> cb) {
    size_t offset_to_field = 0;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      code_.SetValue("FIELD_TYPE", GetTypeGet(field.value.type));
      code_.SetValue("FIELD_OTY", ObjectFieldType(field, false));
      code_.SetValue("FIELD", namer_.Field(field));
      code_.SetValue("FIELD_OFFSET", NumToString(offset_to_field));
      code_.SetValue(
          "REF",
          IsStruct(field.value.type) || IsArray(field.value.type) ? "&" : "");
      code_.IncrementIdentLevel();
      cb(field);
      code_.DecrementIdentLevel();
      const size_t size = InlineSize(field.value.type);
      offset_to_field += size + field.padding;
    }
  }